

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O1

void connect_and_write(uv_connect_t *req,int status)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_loop_t *loop;
  int64_t eval_b;
  int64_t eval_a;
  uv_buf_t buf;
  uv_buf_t uStack_420;
  sockaddr_in sStack_410;
  uv_udp_t uStack_400;
  uv_udp_send_t uStack_348;
  uv_loop_t *puStack_200;
  long lStack_1f0;
  long lStack_1e8;
  sockaddr_in sStack_1e0;
  uv_udp_t uStack_1d0;
  uv_loop_t *puStack_118;
  long lStack_108;
  long lStack_100;
  uv_udp_t uStack_f8;
  uv_connect_t *puStack_40;
  undefined8 local_30;
  long local_28;
  uv_buf_t local_20;
  
  puStack_40 = (uv_connect_t *)0x1b5e86;
  local_20 = uv_buf_init(buffer,0x7fff);
  if (req == &connect_req) {
    local_28 = (long)status;
    local_30 = 0;
    if (local_28 == 0) {
      puStack_40 = (uv_connect_t *)0x1b5edd;
      uv_write(&write_req,connect_req.handle,&local_20,1,write_cb);
      connect_cb_called = connect_cb_called + 1;
      return;
    }
  }
  else {
    puStack_40 = (uv_connect_t *)0x1b5ef2;
    connect_and_write_cold_1();
  }
  puStack_40 = (uv_connect_t *)run_test_udp_ref;
  connect_and_write_cold_2();
  puStack_118 = (uv_loop_t *)0x1b5f0e;
  puStack_40 = req;
  puVar2 = uv_default_loop();
  puStack_118 = (uv_loop_t *)0x1b5f1e;
  uv_udp_init(puVar2,&uStack_f8);
  puStack_118 = (uv_loop_t *)0x1b5f26;
  uv_unref((uv_handle_t *)&uStack_f8);
  puStack_118 = (uv_loop_t *)0x1b5f2b;
  puVar2 = uv_default_loop();
  puStack_118 = (uv_loop_t *)0x1b5f35;
  uv_run(puVar2,UV_RUN_DEFAULT);
  puStack_118 = (uv_loop_t *)0x1b5f3d;
  do_close(&uStack_f8);
  puStack_118 = (uv_loop_t *)0x1b5f42;
  loop = uv_default_loop();
  puStack_118 = (uv_loop_t *)0x1b5f56;
  uv_walk(loop,close_walk_cb,(void *)0x0);
  puStack_118 = (uv_loop_t *)0x1b5f60;
  uv_run(loop,UV_RUN_DEFAULT);
  lStack_100 = 0;
  puStack_118 = (uv_loop_t *)0x1b5f6e;
  puVar2 = uv_default_loop();
  puStack_118 = (uv_loop_t *)0x1b5f76;
  iVar1 = uv_loop_close(puVar2);
  lStack_108 = (long)iVar1;
  if (lStack_100 == lStack_108) {
    puStack_118 = (uv_loop_t *)0x1b5f8e;
    uv_library_shutdown();
    return;
  }
  puStack_118 = (uv_loop_t *)run_test_udp_ref2;
  run_test_udp_ref_cold_1();
  puStack_200 = (uv_loop_t *)0x1b5fc6;
  puStack_118 = loop;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_1e0);
  uStack_1d0.data = (void *)(long)iVar1;
  lStack_1f0 = 0;
  if (uStack_1d0.data == (void *)0x0) {
    puStack_200 = (uv_loop_t *)0x1b5feb;
    puVar2 = uv_default_loop();
    puStack_200 = (uv_loop_t *)0x1b5ffb;
    uv_udp_init(puVar2,&uStack_1d0);
    puStack_200 = (uv_loop_t *)0x1b600a;
    uv_udp_bind(&uStack_1d0,(sockaddr *)&sStack_1e0,0);
    puStack_200 = (uv_loop_t *)0x1b601c;
    uv_udp_recv_start(&uStack_1d0,fail_cb,fail_cb);
    puStack_200 = (uv_loop_t *)0x1b6024;
    uv_unref((uv_handle_t *)&uStack_1d0);
    puStack_200 = (uv_loop_t *)0x1b6029;
    puVar2 = uv_default_loop();
    puStack_200 = (uv_loop_t *)0x1b6033;
    uv_run(puVar2,UV_RUN_DEFAULT);
    puStack_200 = (uv_loop_t *)0x1b603b;
    do_close(&uStack_1d0);
    puStack_200 = (uv_loop_t *)0x1b6040;
    loop = uv_default_loop();
    puStack_200 = (uv_loop_t *)0x1b6054;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    puStack_200 = (uv_loop_t *)0x1b605e;
    uv_run(loop,UV_RUN_DEFAULT);
    lStack_1f0 = 0;
    puStack_200 = (uv_loop_t *)0x1b606c;
    puVar2 = uv_default_loop();
    puStack_200 = (uv_loop_t *)0x1b6074;
    iVar1 = uv_loop_close(puVar2);
    lStack_1e8 = (long)iVar1;
    if (lStack_1f0 == lStack_1e8) {
      puStack_200 = (uv_loop_t *)0x1b608c;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_200 = (uv_loop_t *)0x1b60a6;
    run_test_udp_ref2_cold_1();
  }
  puStack_200 = (uv_loop_t *)run_test_udp_ref3;
  run_test_udp_ref2_cold_2();
  puStack_200 = loop;
  uStack_420 = uv_buf_init("PING",4);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_410);
  uStack_348.data = (void *)(long)iVar1;
  uStack_400.data = (void *)0x0;
  if (uStack_348.data == (void *)0x0) {
    puVar2 = uv_default_loop();
    uv_udp_init(puVar2,&uStack_400);
    uv_udp_send(&uStack_348,&uStack_400,&uStack_420,1,(sockaddr *)&sStack_410,req_cb);
    uv_unref((uv_handle_t *)&uStack_400);
    puVar2 = uv_default_loop();
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (req_cb_called == 1) {
      do_close(&uStack_400);
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return;
      }
      goto LAB_001b6208;
    }
  }
  else {
    run_test_udp_ref3_cold_1();
  }
  run_test_udp_ref3_cold_2();
LAB_001b6208:
  run_test_udp_ref3_cold_3();
  req_cb_called = req_cb_called + 1;
  return;
}

Assistant:

static void connect_and_write(uv_connect_t* req, int status) {
  uv_buf_t buf = uv_buf_init(buffer, sizeof buffer);
  ASSERT_PTR_EQ(req, &connect_req);
  ASSERT_OK(status);
  uv_write(&write_req, req->handle, &buf, 1, write_cb);
  connect_cb_called++;
}